

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test10::prepareArgument
          (GPUShaderFP64Test10 *this,functionObject *function_object,GLuint vertex,GLubyte *buffer)

{
  uint uVar1;
  GLuint GVar2;
  uint local_30;
  GLuint offset;
  GLuint argument;
  GLuint n_arguments;
  GLubyte *buffer_local;
  GLuint vertex_local;
  functionObject *function_object_local;
  GPUShaderFP64Test10 *this_local;
  
  uVar1 = (*function_object->_vptr_functionObject[3])();
  for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
    GVar2 = functionObject::getArgumentOffset(function_object,local_30);
    prepareComponents(this,function_object,vertex,local_30,buffer + GVar2);
  }
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareArgument(const functionObject& function_object, glw::GLuint vertex,
										  glw::GLubyte* buffer)
{
	const glw::GLuint n_arguments = function_object.getArgumentCount();

	for (glw::GLuint argument = 0; argument < n_arguments; ++argument)
	{
		const glw::GLuint offset = function_object.getArgumentOffset(argument);

		prepareComponents(function_object, vertex, argument, buffer + offset);
	}
}